

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O3

void * alsa_run_thread(void *context)

{
  pthread_mutex_t *__mutex;
  pthread_mutex_t *__mutex_00;
  float fVar1;
  long *plVar2;
  void *pvVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  snd_pcm_state_t sVar8;
  undefined4 uVar9;
  long lVar10;
  undefined4 *puVar11;
  ulong uVar12;
  snd_pcm_uframes_t sVar13;
  long lVar14;
  snd_pcm_uframes_t sVar15;
  ssize_t sVar16;
  snd_pcm_uframes_t sVar17;
  uint uVar18;
  long *plVar19;
  ulong uVar20;
  undefined8 uVar21;
  float *b;
  long drain_frames;
  size_t sVar22;
  long lVar23;
  char dummy;
  unsigned_short revents;
  long local_58;
  undefined1 local_49;
  void *local_48;
  unsigned_short local_3a;
  pthread_cond_t *local_38;
  
  __mutex = (pthread_mutex_t *)((long)context + 0x18);
  do {
    pthread_mutex_lock(__mutex);
    if (*(int *)((long)context + 0xd0) != 0) {
      sVar22 = 1;
      lVar10 = 0;
      do {
        lVar23 = *(long *)((long)context + lVar10 * 8 + 0x40);
        if ((lVar23 != 0) && (*(undefined8 *)(lVar23 + 0xc0) = 0, *(int *)(lVar23 + 0xb0) == 1)) {
          sVar22 = sVar22 + *(long *)(lVar23 + 200);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x10);
      free(*(void **)((long)context + 0xc0));
      puVar11 = (undefined4 *)calloc(sVar22,8);
      *(undefined4 **)((long)context + 0xc0) = puVar11;
      *(size_t *)((long)context + 200) = sVar22;
      *puVar11 = *(undefined4 *)((long)context + 0xd8);
      *(undefined2 *)(puVar11 + 1) = 9;
      lVar10 = 1;
      lVar23 = 0;
      do {
        lVar14 = *(long *)((long)context + lVar23 * 8 + 0x40);
        if ((lVar14 != 0) && (*(int *)(lVar14 + 0xb0) == 1)) {
          memcpy(puVar11 + lVar10 * 2,*(void **)(lVar14 + 0xb8),*(long *)(lVar14 + 200) << 3);
          puVar11 = *(undefined4 **)((long)context + 0xc0);
          *(undefined4 **)(lVar14 + 0xc0) = puVar11 + lVar10 * 2;
          lVar10 = lVar10 + *(long *)(lVar14 + 200);
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 0x10);
      *(undefined4 *)((long)context + 0xd0) = 0;
    }
    iVar7 = 1000;
    lVar10 = 0;
    do {
      lVar23 = *(long *)((long)context + lVar10 * 8 + 0x40);
      if ((lVar23 != 0) && (*(int *)(lVar23 + 0xb0) == 2)) {
        iVar6 = timeval_to_relative_ms((timeval *)(lVar23 + 0xd0));
        iVar5 = iVar6;
        if (iVar7 < iVar6) {
          iVar5 = iVar7;
        }
        if (-1 < iVar6) {
          iVar7 = iVar5;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x10);
    pthread_mutex_unlock(__mutex);
    iVar7 = poll(*(pollfd **)((long)context + 0xc0),*(nfds_t *)((long)context + 200),iVar7);
    pthread_mutex_lock(__mutex);
    if (iVar7 < 1) {
      if (iVar7 == 0) {
        lVar10 = 0;
        do {
          plVar2 = *(long **)((long)context + lVar10 * 8 + 0x40);
          if (plVar2 != (long *)0x0) {
            iVar7 = (int)plVar2[0x16];
            if (iVar7 == 2) {
              iVar7 = timeval_to_relative_ms((timeval *)(plVar2 + 0x1a));
              if (0 < iVar7) {
                iVar7 = (int)plVar2[0x16];
                goto LAB_00126517;
              }
              uVar21 = 2;
              uVar9 = 0;
            }
            else {
LAB_00126517:
              if ((iVar7 != 1) ||
                 (iVar7 = timeval_to_relative_ms((timeval *)(plVar2 + 0x1c)), -0x2711 < iVar7))
              goto LAB_0012658a;
              uVar21 = 3;
              uVar9 = 4;
            }
            lVar23 = *plVar2;
            *(undefined4 *)(plVar2 + 0x16) = uVar9;
            pthread_cond_broadcast((pthread_cond_t *)(plVar2 + 0x10));
            *(undefined4 *)(lVar23 + 0xd0) = 1;
            write(*(int *)(lVar23 + 0xdc),"x",1);
            (*(code *)plVar2[9])(plVar2,plVar2[1],uVar21);
          }
LAB_0012658a:
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x10);
      }
    }
    else {
      if (((*(byte *)(*(long *)((long)context + 0xc0) + 6) & 1) != 0) &&
         (read(*(int *)((long)context + 0xd8),&local_49,1), *(int *)((long)context + 0xd4) != 0)) {
        pthread_mutex_unlock(__mutex);
        return (void *)0x0;
      }
      lVar10 = 0;
      do {
        plVar2 = *(long **)((long)context + lVar10 * 8 + 0x40);
        if ((((plVar2 != (long *)0x0) && ((int)plVar2[0x16] == 1)) && (plVar2[0x18] != 0)) &&
           (plVar2[0x19] != 0)) {
          lVar23 = 0;
LAB_00125ec9:
          if (*(short *)(plVar2[0x18] + 6 + lVar23 * 8) == 0) goto code_r0x00125ed1;
          lVar23 = *plVar2;
          *(undefined4 *)(plVar2 + 0x16) = 3;
          local_38 = (pthread_cond_t *)(plVar2 + 0x10);
          pthread_cond_broadcast(local_38);
          *(undefined4 *)(lVar23 + 0xd0) = 1;
          write(*(int *)(lVar23 + 0xdc),"x",1);
          pthread_mutex_unlock(__mutex);
          __mutex_00 = (pthread_mutex_t *)(plVar2 + 2);
          pthread_mutex_lock(__mutex_00);
          (*cubeb_snd_pcm_poll_descriptors_revents)
                    ((snd_pcm_t *)plVar2[7],(pollfd *)plVar2[0x18],*(uint *)(plVar2 + 0x19),
                     &local_3a);
          uVar12 = (*cubeb_snd_pcm_avail_update)((snd_pcm_t *)plVar2[7]);
          if (uVar12 == 0) {
            pthread_mutex_unlock(__mutex_00);
            local_58._0_4_ = 1;
            goto LAB_0012648e;
          }
          uVar20 = plVar2[0xc];
          if (uVar20 < (uVar12 & 0xffffffff)) {
            uVar12 = uVar20;
          }
          iVar7 = (int)plVar2[0x21];
          sVar13 = uVar12;
          if ((iVar7 == 1) && (0 < (long)uVar12)) {
            lVar23 = plVar2[0x20];
            if (uVar20 < lVar23 + uVar12) {
              plVar2[0x20] = 0;
              lVar23 = 0;
            }
            sVar13 = (*cubeb_snd_pcm_readi)
                               ((snd_pcm_t *)plVar2[7],(void *)(lVar23 + plVar2[0x1f]),uVar12);
            if (-1 < (long)sVar13) {
              plVar2[0x20] = plVar2[0x20] + sVar13;
              plVar2[10] = plVar2[10] + sVar13;
              gettimeofday((timeval *)(plVar2 + 0x1c),(__timezone_ptr_t)0x0);
              sVar13 = uVar12;
            }
            iVar7 = (int)plVar2[0x21];
          }
          sVar17 = sVar13;
          if ((iVar7 == 1) && (lVar23 = plVar2[0x20], lVar23 != 0)) {
            plVar19 = (long *)plVar2[0x22];
            if (plVar19 == (long *)0x0) {
              local_58 = 0;
              plVar19 = plVar2;
            }
            else {
              uVar12 = plVar19[0x20];
              lVar14 = plVar19[0xc] - uVar12;
              if ((ulong)plVar19[0xc] < uVar12 || lVar14 == 0) goto LAB_001260f7;
              local_58 = uVar12 + plVar19[0x1f];
              if (lVar14 <= lVar23) {
                lVar23 = lVar14;
              }
            }
            pthread_mutex_unlock(__mutex_00);
            sVar15 = (*(code *)plVar2[8])(plVar19,plVar2[1],plVar2[0x1f],local_58,lVar23);
            pthread_mutex_lock(__mutex_00);
            sVar17 = sVar15;
            if (-1 < (long)sVar15) {
              lVar23 = plVar2[0x1f];
              sVar16 = (*cubeb_snd_pcm_frames_to_bytes)((snd_pcm_t *)plVar2[7],sVar15);
              pvVar3 = (void *)plVar2[0x1f];
              sVar22 = (*cubeb_snd_pcm_frames_to_bytes)
                                 ((snd_pcm_t *)plVar2[7],plVar2[0x20] - sVar15);
              memmove(pvVar3,(void *)(lVar23 + sVar16),sVar22);
              plVar2[0x20] = plVar2[0x20] - sVar15;
              sVar17 = sVar13;
              if (plVar2[0x22] != 0) {
                plVar19 = (long *)(plVar2[0x22] + 0x100);
                *plVar19 = *plVar19 + sVar15;
              }
            }
          }
LAB_001260f7:
          local_58._0_4_ = 1;
          sVar13 = sVar17;
          if ((int)plVar2[0x21] == 0) {
            lVar23 = plVar2[0x20];
            lVar14 = sVar17 - lVar23;
            if (lVar14 != 0 && lVar23 <= (long)sVar17) {
              lVar4 = plVar2[0x22];
              if (lVar4 == 0) {
                uVar21 = 0;
              }
              else {
                if (*(long *)(lVar4 + 0x100) == 0) goto LAB_00126229;
                uVar21 = *(undefined8 *)(lVar4 + 0xf8);
              }
              local_48 = (void *)plVar2[0x1f];
              sVar16 = (*cubeb_snd_pcm_frames_to_bytes)((snd_pcm_t *)plVar2[7],lVar23);
              if ((plVar2[0x22] != 0) &&
                 (lVar23 = *(long *)(plVar2[0x22] + 0x100), lVar23 <= lVar14)) {
                lVar14 = lVar23;
              }
              lVar23 = (long)local_48 + sVar16;
              pthread_mutex_unlock(__mutex_00);
              sVar15 = (*(code *)plVar2[8])(plVar2,plVar2[1],uVar21,lVar23,lVar14);
              pthread_mutex_lock(__mutex_00);
              sVar13 = sVar15;
              if (-1 < (long)sVar15) {
                plVar2[0x20] = plVar2[0x20] + sVar15;
                lVar23 = plVar2[0x22];
                sVar13 = sVar17;
                if (lVar23 != 0) {
                  lVar14 = *(long *)(lVar23 + 0xf8);
                  sVar16 = (*cubeb_snd_pcm_frames_to_bytes)(*(snd_pcm_t **)(lVar23 + 0x38),sVar15);
                  local_48 = *(void **)(lVar23 + 0xf8);
                  sVar22 = (*cubeb_snd_pcm_frames_to_bytes)
                                     (*(snd_pcm_t **)(lVar23 + 0x38),
                                      *(long *)(lVar23 + 0x100) - sVar15);
                  memmove(local_48,(void *)(lVar14 + sVar16),sVar22);
                  *(long *)(lVar23 + 0x100) = *(long *)(lVar23 + 0x100) - sVar15;
                }
              }
            }
LAB_00126229:
            if ((int)plVar2[0x21] == 0) {
              lVar23 = plVar2[0x20];
              lVar14 = sVar13 - lVar23;
              if (lVar14 != 0 && lVar23 <= (long)sVar13) {
                uVar18 = *(uint *)((long)plVar2 + 0x6c);
                lVar4 = plVar2[0x1f];
                sVar16 = (*cubeb_snd_pcm_frames_to_bytes)((snd_pcm_t *)plVar2[7],lVar23);
                sVar22 = (*cubeb_snd_pcm_frames_to_bytes)((snd_pcm_t *)plVar2[7],lVar14);
                memset((void *)(lVar4 + sVar16),0,sVar22);
                plVar2[0x20] = sVar13;
                if ((plVar2[0x22] == 0) ||
                   (local_58._0_4_ = 1, *(long *)(plVar2[0x22] + 0x100) != 0)) {
                  uVar20 = (ulong)(((double)lVar14 / (double)uVar18) * 1000.0);
                  gettimeofday((timeval *)(plVar2 + 0x1a),(__timezone_ptr_t)0x0);
                  uVar12 = uVar20 & 0xffffffff;
                  plVar2[0x1a] = plVar2[0x1a] + uVar12 / 1000;
                  plVar2[0x1b] = plVar2[0x1b] +
                                 (ulong)(uint)(((int)uVar20 + (int)(uVar12 / 1000) * -1000) * 1000);
                  local_58._0_4_ = 2;
                }
              }
            }
          }
          if (((int)plVar2[0x21] != 0) || ((long)sVar13 < 1)) goto LAB_00126415;
          uVar18 = *(uint *)(plVar2 + 0xe);
          uVar12 = sVar13 * uVar18;
          pvVar3 = (void *)plVar2[0x1f];
          if ((int)plVar2[0xd] == 2) {
            if (uVar18 != 0) {
              uVar18 = 1;
              uVar20 = 0;
              do {
                *(float *)((long)pvVar3 + uVar20 * 4) =
                     *(float *)(plVar2 + 0x1e) * *(float *)((long)pvVar3 + uVar20 * 4);
                uVar20 = (ulong)uVar18;
                uVar18 = uVar18 + 1;
              } while (uVar20 <= uVar12 && uVar12 - uVar20 != 0);
            }
          }
          else if (uVar18 != 0) {
            fVar1 = *(float *)(plVar2 + 0x1e);
            uVar18 = 1;
            uVar20 = 0;
            do {
              *(short *)((long)pvVar3 + uVar20 * 2) =
                   (short)(int)((float)(int)*(short *)((long)pvVar3 + uVar20 * 2) * fVar1);
              uVar20 = (ulong)uVar18;
              uVar18 = uVar18 + 1;
            } while (uVar20 <= uVar12 && uVar12 - uVar20 != 0);
          }
          sVar17 = (*cubeb_snd_pcm_writei)((snd_pcm_t *)plVar2[7],pvVar3,sVar13);
          if ((long)sVar17 < 0) {
LAB_00126429:
            iVar7 = (*cubeb_snd_pcm_recover)((snd_pcm_t *)plVar2[7],(int)sVar17,0);
            if ((-1 < iVar7) &&
               ((((int)plVar2[0x21] != 1 ||
                 (sVar8 = (*cubeb_snd_pcm_state)((snd_pcm_t *)plVar2[7]),
                 sVar8 != SND_PCM_STATE_PREPARED)) ||
                (iVar7 = (*cubeb_snd_pcm_start)((snd_pcm_t *)plVar2[7]), -1 < iVar7))))
            goto LAB_00126462;
            pthread_mutex_unlock(__mutex_00);
            (*(code *)plVar2[9])(plVar2,plVar2[1],3);
            local_58._0_4_ = 4;
          }
          else {
            lVar23 = plVar2[0x1f];
            sVar16 = (*cubeb_snd_pcm_frames_to_bytes)((snd_pcm_t *)plVar2[7],sVar17);
            pvVar3 = (void *)plVar2[0x1f];
            sVar22 = (*cubeb_snd_pcm_frames_to_bytes)((snd_pcm_t *)plVar2[7],plVar2[0x20] - sVar17);
            memmove(pvVar3,(void *)(lVar23 + sVar16),sVar22);
            plVar2[0x20] = plVar2[0x20] - sVar17;
            plVar2[10] = plVar2[10] + sVar17;
            gettimeofday((timeval *)(plVar2 + 0x1c),(__timezone_ptr_t)0x0);
LAB_00126415:
            sVar17 = sVar13;
            if ((long)sVar13 < 0) goto LAB_00126429;
LAB_00126462:
            pthread_mutex_unlock(__mutex_00);
          }
LAB_0012648e:
          pthread_mutex_lock(__mutex);
          lVar23 = *plVar2;
          *(undefined4 *)(plVar2 + 0x16) = (undefined4)local_58;
          pthread_cond_broadcast(local_38);
          *(undefined4 *)(lVar23 + 0xd0) = 1;
          write(*(int *)(lVar23 + 0xdc),"x",1);
        }
LAB_001264cc:
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x10);
    }
    pthread_mutex_unlock(__mutex);
  } while( true );
code_r0x00125ed1:
  lVar23 = lVar23 + 1;
  if (plVar2[0x19] == lVar23) goto LAB_001264cc;
  goto LAB_00125ec9;
}

Assistant:

static void *
alsa_run_thread(void * context)
{
  cubeb * ctx = context;
  int r;

  do {
    r = alsa_run(ctx);
  } while (r >= 0);

  return NULL;
}